

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall
HighsSparseMatrix::createRowwisePartitioned
          (HighsSparseMatrix *this,HighsSparseMatrix *matrix,int8_t *in_partition)

{
  vector<int,_std::allocator<int>_> *this_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  int *piVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer piVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  size_type sVar15;
  vector<int,_std::allocator<int>_> ar_end;
  value_type_conflict2 local_5c;
  vector<int,_std::allocator<int>_> local_58;
  size_type local_38;
  
  uVar1 = matrix->num_col_;
  uVar2 = matrix->num_row_;
  sVar15 = (size_type)(int)uVar2;
  uVar11 = uVar2;
  if (matrix->format_ == kColwise) {
    uVar11 = uVar1;
  }
  iVar12 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[(int)uVar11];
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&this->start_,sVar15 + 1);
  this_00 = &this->p_end_;
  local_5c = 0;
  local_38 = (long)iVar12;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(this_00,sVar15,&local_5c);
  local_5c = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_58,sVar15,&local_5c);
  sVar15 = local_38;
  if (0 < (int)uVar1) {
    piVar4 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      if ((in_partition == (int8_t *)0x0) || (in_partition[uVar13] != '\0')) {
        lVar14 = (long)piVar4[uVar13];
        if (piVar4[uVar13] < piVar4[uVar13 + 1]) {
          do {
            piVar7 = piVar6 + piVar5[lVar14];
            *piVar7 = *piVar7 + 1;
            lVar14 = lVar14 + 1;
          } while (lVar14 < piVar4[uVar13 + 1]);
        }
      }
      else {
        lVar14 = (long)piVar4[uVar13];
        if (piVar4[uVar13] < piVar4[uVar13 + 1]) {
          do {
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[piVar5[lVar14]] =
                 local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar5[lVar14]] + 1;
            lVar14 = lVar14 + 1;
          } while (lVar14 < piVar4[uVar13 + 1]);
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar1);
  }
  piVar7 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar7 = 0;
  if (0 < (int)uVar2) {
    piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar12 = *piVar7;
    uVar13 = 0;
    do {
      iVar12 = iVar12 + piVar4[uVar13] +
               local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13];
      piVar7[uVar13 + 1] = iVar12;
      uVar13 = uVar13 + 1;
    } while (uVar2 != uVar13);
  }
  if (0 < (int)uVar2) {
    piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13] = piVar4[uVar13] + piVar7[uVar13];
      piVar4[uVar13] = piVar7[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar2 != uVar13);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->index_,local_38);
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,sVar15);
  if (0 < (int)uVar1) {
    piVar4 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar10 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      if ((in_partition == (int8_t *)0x0) || (in_partition[uVar13] != '\0')) {
        lVar14 = (long)piVar4[uVar13];
        if (piVar4[uVar13] < piVar4[uVar13 + 1]) {
          do {
            iVar12 = piVar5[lVar14];
            iVar3 = piVar10[iVar12];
            piVar10[iVar12] = iVar3 + 1;
            piVar6[iVar3] = (int)uVar13;
            pdVar9[iVar3] = pdVar8[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 < piVar4[uVar13 + 1]);
        }
      }
      else {
        lVar14 = (long)piVar4[uVar13];
        if (piVar4[uVar13] < piVar4[uVar13 + 1]) {
          do {
            iVar12 = piVar5[lVar14];
            iVar3 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar12];
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar12] = iVar3 + 1;
            piVar6[iVar3] = (int)uVar13;
            pdVar9[iVar3] = pdVar8[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 < piVar4[uVar13 + 1]);
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar1);
  }
  this->format_ = kRowwisePartitioned;
  this->num_col_ = uVar1;
  this->num_row_ = uVar2;
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsSparseMatrix::createRowwisePartitioned(
    const HighsSparseMatrix& matrix, const int8_t* in_partition) {
  assert(matrix.formatOk());
  assert(matrix.isColwise());
  assert(this->formatOk());
  const bool all_in_partition = in_partition == NULL;

  HighsInt num_col = matrix.num_col_;
  HighsInt num_row = matrix.num_row_;
  HighsInt num_nz = matrix.numNz();
  const vector<HighsInt>& a_start = matrix.start_;
  const vector<HighsInt>& a_index = matrix.index_;
  const vector<double>& a_value = matrix.value_;
  vector<HighsInt>& ar_start = this->start_;
  vector<HighsInt>& ar_p_end = this->p_end_;
  vector<HighsInt>& ar_index = this->index_;
  vector<double>& ar_value = this->value_;

  // Use ar_p_end and ar_end to compute lengths, which are then transformed into
  // the p_ends and ends of the inserted entries
  std::vector<HighsInt> ar_end;
  ar_start.resize(num_row + 1);
  ar_p_end.assign(num_row, 0);
  ar_end.assign(num_row, 0);
  // Count the nonzeros of nonbasic and basic columns in each row
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (all_in_partition || in_partition[iCol]) {
      for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
        HighsInt iRow = a_index[iEl];
        ar_p_end[iRow]++;
      }
    } else {
      for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
        HighsInt iRow = a_index[iEl];
        ar_end[iRow]++;
      }
    }
  }
  // Compute the starts and turn the lengths into ends
  ar_start[0] = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++)
    ar_start[iRow + 1] = ar_start[iRow] + ar_p_end[iRow] + ar_end[iRow];
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    ar_end[iRow] = ar_start[iRow] + ar_p_end[iRow];
    ar_p_end[iRow] = ar_start[iRow];
  }
  // Insert the entries
  ar_index.resize(num_nz);
  ar_value.resize(num_nz);
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (all_in_partition || in_partition[iCol]) {
      for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
        HighsInt iRow = a_index[iEl];
        HighsInt iToEl = ar_p_end[iRow]++;
        ar_index[iToEl] = iCol;
        ar_value[iToEl] = a_value[iEl];
      }
    } else {
      for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
        HighsInt iRow = a_index[iEl];
        HighsInt iToEl = ar_end[iRow]++;
        ar_index[iToEl] = iCol;
        ar_value[iToEl] = a_value[iEl];
      }
    }
  }
  this->format_ = MatrixFormat::kRowwisePartitioned;
  this->num_col_ = num_col;
  this->num_row_ = num_row;
}